

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char *pcVar1;
  size_t sVar2;
  char *buf_ptr;
  char local_41;
  scoped_padder p;
  
  scoped_padder::scoped_padder(&p,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar1 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar2 = strlen(pcVar1);
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar1,pcVar1 + sVar2);
  local_41 = ' ';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_41);
  pcVar1 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar2 = strlen(pcVar1);
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar1,pcVar1 + sVar2);
  local_41 = ' ';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_41);
  fmt_helper::append_int<int>(tm_time->tm_mday,dest);
  local_41 = ' ';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_41);
  fmt_helper::pad2(tm_time->tm_hour,dest);
  local_41 = ':';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_41);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_41 = ':';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_41);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_41 = ' ';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_41);
  fmt_helper::append_int<int>(tm_time->tm_year + 0x76c,dest);
  scoped_padder::~scoped_padder(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }